

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O0

void Cut_CellTruthElem(uint *InA,uint *InB,uint *InC,uint *pOut,int nVars,int Type)

{
  int iVar1;
  int local_38;
  int i;
  int nWords;
  int Type_local;
  int nVars_local;
  uint *pOut_local;
  uint *InC_local;
  uint *InB_local;
  uint *InA_local;
  
  iVar1 = Extra_TruthWordNum(nVars);
  if (0x15 < Type) {
    __assert_fail("Type < 22",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutPre22.c"
                  ,0x283,
                  "void Cut_CellTruthElem(unsigned int *, unsigned int *, unsigned int *, unsigned int *, int, int)"
                 );
  }
  switch(Type) {
  case 0:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = 0;
    }
    break;
  case 1:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = 0xffffffff;
    }
    break;
  case 2:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38];
    }
    break;
  case 3:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & InB[local_38];
    }
    break;
  case 4:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & InB[local_38] ^ 0xffffffff;
    }
    break;
  case 5:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] ^ InB[local_38];
    }
    break;
  case 6:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & InB[local_38] & InC[local_38];
    }
    break;
  case 7:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & InB[local_38] & InC[local_38] ^ 0xffffffff;
    }
    break;
  case 8:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & (InB[local_38] | InC[local_38]);
    }
    break;
  case 9:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & (InB[local_38] | InC[local_38]) ^ 0xffffffff;
    }
    break;
  case 10:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] ^ InB[local_38] ^ InC[local_38];
    }
    break;
  case 0xb:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] ^ InB[local_38] & InC[local_38];
    }
    break;
  case 0xc:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & (InB[local_38] ^ InC[local_38]);
    }
    break;
  case 0xd:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] = InA[local_38] & (InB[local_38] ^ InC[local_38]) ^ 0xffffffff;
    }
    break;
  case 0xe:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           InA[local_38] & InB[local_38] | InB[local_38] & InC[local_38] |
           InA[local_38] & InC[local_38];
    }
    break;
  case 0xf:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           InA[local_38] & InB[local_38] & InC[local_38] |
           (InA[local_38] ^ 0xffffffff) & (InB[local_38] ^ 0xffffffff) &
           (InC[local_38] ^ 0xffffffff);
    }
    break;
  case 0x10:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           (InA[local_38] & InB[local_38] & InC[local_38] |
           (InA[local_38] ^ 0xffffffff) & (InB[local_38] ^ 0xffffffff) &
           (InC[local_38] ^ 0xffffffff)) ^ 0xffffffff;
    }
    break;
  case 0x11:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           InA[local_38] & InB[local_38] | InB[local_38] & InC[local_38] |
           (InA[local_38] ^ 0xffffffff) & InC[local_38];
    }
    break;
  case 0x12:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           (InA[local_38] ^ 0xffffffff) & InB[local_38] & InC[local_38] |
           InA[local_38] & (InB[local_38] ^ 0xffffffff) & InC[local_38] |
           InA[local_38] & InB[local_38] & (InC[local_38] ^ 0xffffffff);
    }
    break;
  case 0x13:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           ((InA[local_38] ^ 0xffffffff) & InB[local_38] & InC[local_38] |
            InA[local_38] & (InB[local_38] ^ 0xffffffff) & InC[local_38] |
           InA[local_38] & InB[local_38] & (InC[local_38] ^ 0xffffffff)) ^ 0xffffffff;
    }
    break;
  case 0x14:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           InA[local_38] & (InB[local_38] ^ 0xffffffff) & (InC[local_38] ^ 0xffffffff) |
           InB[local_38] & InC[local_38];
    }
    break;
  case 0x15:
    for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
      pOut[local_38] =
           (InA[local_38] & (InB[local_38] ^ 0xffffffff) & (InC[local_38] ^ 0xffffffff) |
           InB[local_38] & InC[local_38]) ^ 0xffffffff;
    }
  }
  return;
}

Assistant:

void Cut_CellTruthElem( unsigned * InA, unsigned * InB, unsigned * InC, unsigned * pOut, int nVars, int Type )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i;

    assert( Type < 22 );
    switch ( Type )
    {
    // " 0\n",                         // 00   const 0
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = 0;
        return;
    // " 1\n",                         // 01   const 1
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = 0xFFFFFFFF;
        return;
    // "1 1\n",                        // 02   a
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i];
        return;
    // "11 1\n",                       // 03   ab
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & InB[i];
        return;
    // "11 0\n",                       // 04   (ab)'
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & InB[i]);
        return;
    // "10 1\n01 1\n",                 // 05   a<+>b
    case 5:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] ^ InB[i];
        return;
    // "111 1\n",                      // 06 + abc
    case 6:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & InB[i] & InC[i];
        return;
    // "111 0\n",                      // 07   (abc)'
    case 7:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & InB[i] & InC[i]);
        return;
    // "11- 1\n1-1 1\n",               // 08 + a(b+c)
    case 8:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & (InB[i] | InC[i]);
        return;
    // "11- 0\n1-1 0\n",               // 09   (a(b+c))'
    case 9:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & (InB[i] | InC[i]));
        return;
    // "111 1\n100 1\n010 1\n001 1\n", // 10 + a<+>b<+>c
    case 10:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] ^ InB[i] ^ InC[i];
        return;
    // "10- 0\n1-0 0\n011 0\n",        // 11 + a<+>bc
    case 11:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] ^ (InB[i] & InC[i]);
        return;
    // "101 1\n110 1\n",               // 12 + a(b<+>c)
    case 12:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = InA[i] & (InB[i] ^ InC[i]);
        return;
    // "101 0\n110 0\n",               // 13   (a(b<+>c))'
    case 13:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~(InA[i] & (InB[i] ^ InC[i]));
        return;
    // "11- 1\n1-1 1\n-11 1\n",        // 14 + ab+bc+ac
    case 14:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & InB[i]) | (InB[i] & InC[i]) | (InA[i] & InC[i]);
        return;
    // "111 1\n000 1\n",               // 15 + abc+a'b'c'
    case 15:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & InB[i] & InC[i]) | (~InA[i] & ~InB[i] & ~InC[i]);
        return;
    // "111 0\n000 0\n",               // 16   (abc+a'b'c')'
    case 16:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~((InA[i] & InB[i] & InC[i]) | (~InA[i] & ~InB[i] & ~InC[i]));
        return;
    // "11- 1\n-11 1\n0-1 1\n",        // 17 + ab+bc+a'c
    case 17:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & InB[i]) | (InB[i] & InC[i]) | (~InA[i] & InC[i]);
        return;
    // "011 1\n101 1\n110 1\n",        // 18 + a'bc+ab'c+abc'
    case 18:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (~InA[i] & InB[i] & InC[i]) | (InA[i] & ~InB[i] & InC[i]) | (InA[i] & InB[i] & ~InC[i]);
        return;
    // "011 0\n101 0\n110 0\n",        // 19   (a'bc+ab'c+abc')'
    case 19:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~((~InA[i] & InB[i] & InC[i]) | (InA[i] & ~InB[i] & InC[i]) | (InA[i] & InB[i] & ~InC[i]));
        return;
    // "100 1\n-11 1\n",               // 20 + ab'c'+bc
    case 20:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (InA[i] & ~InB[i] & ~InC[i]) | (InB[i] & InC[i]);
        return;
    // "100 0\n-11 0\n"                // 21   (ab'c'+bc)'
    case 21:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = ~((InA[i] & ~InB[i] & ~InC[i]) | (InB[i] & InC[i]));
        return;
    }
}